

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O1

void ft_trig_pseudo_rotate(FT_Vector *vec,FT_Angle theta)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  FT_Angle FVar6;
  FT_Angle *pFVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar3 = vec->x;
  lVar5 = vec->y;
  lVar8 = lVar3;
  FVar6 = theta;
  if (theta < -0x2d0000) {
    do {
      lVar3 = lVar5;
      lVar5 = -lVar8;
      theta = FVar6 + 0x5a0000;
      bVar2 = FVar6 < -0x870000;
      lVar8 = lVar3;
      FVar6 = theta;
    } while (bVar2);
  }
  lVar8 = lVar5;
  lVar4 = theta;
  if (0x2d0000 < theta) {
    do {
      lVar5 = lVar3;
      lVar3 = -lVar8;
      theta = lVar4 + -0x5a0000;
      bVar2 = 0x870000 < lVar4;
      lVar8 = lVar5;
      lVar4 = theta;
    } while (bVar2);
  }
  pFVar7 = ft_trig_arctan_table;
  lVar4 = 1;
  lVar8 = 1;
  do {
    lVar9 = lVar8 + lVar5 >> ((byte)lVar4 & 0x3f);
    lVar10 = lVar8 + lVar3 >> ((byte)lVar4 & 0x3f);
    lVar1 = *pFVar7;
    if (theta < 0) {
      lVar10 = -lVar10;
    }
    else {
      lVar9 = -lVar9;
      lVar1 = -lVar1;
    }
    theta = theta + lVar1;
    lVar5 = lVar5 + lVar10;
    lVar3 = lVar3 + lVar9;
    pFVar7 = pFVar7 + 1;
    lVar8 = lVar8 * 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x17);
  vec->x = lVar3;
  vec->y = lVar5;
  return;
}

Assistant:

static void
  ft_trig_pseudo_rotate( FT_Vector*  vec,
                         FT_Angle    theta )
  {
    FT_Int           i;
    FT_Fixed         x, y, xtemp, b;
    const FT_Angle  *arctanptr;


    x = vec->x;
    y = vec->y;

    /* Rotate inside [-PI/4,PI/4] sector */
    while ( theta < -FT_ANGLE_PI4 )
    {
      xtemp  =  y;
      y      = -x;
      x      =  xtemp;
      theta +=  FT_ANGLE_PI2;
    }

    while ( theta > FT_ANGLE_PI4 )
    {
      xtemp  = -y;
      y      =  x;
      x      =  xtemp;
      theta -=  FT_ANGLE_PI2;
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for ( i = 1, b = 1; i < FT_TRIG_MAX_ITERS; b <<= 1, i++ )
    {
      if ( theta < 0 )
      {
        xtemp  = x + ( ( y + b ) >> i );
        y      = y - ( ( x + b ) >> i );
        x      = xtemp;
        theta += *arctanptr++;
      }
      else
      {
        xtemp  = x - ( ( y + b ) >> i );
        y      = y + ( ( x + b ) >> i );
        x      = xtemp;
        theta -= *arctanptr++;
      }
    }

    vec->x = x;
    vec->y = y;
  }